

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

void google::protobuf::Int64Value::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  string *psVar1;
  Int64Value *_this;
  Int64Value *local_20;
  Int64Value *local_18 [2];
  
  local_20 = (Int64Value *)to_msg;
  local_18[0] = (Int64Value *)from_msg;
  psVar1 = absl::lts_20240722::log_internal::
           Check_NEImpl<google::protobuf::Int64Value_const*,google::protobuf::Int64Value*>
                     (local_18,&local_20,"&from != _this");
  if (psVar1 == (string *)0x0) {
    if (from_msg[1]._vptr_MessageLite != (_func_int **)0x0) {
      (local_20->field_0)._impl_.value_ = (int64_t)from_msg[1]._vptr_MessageLite;
    }
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/wrappers.pb.cc"
             ,999,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void Int64Value::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Int64Value*>(&to_msg);
  auto& from = static_cast<const Int64Value&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Int64Value)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_value() != 0) {
    _this->_impl_.value_ = from._impl_.value_;
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}